

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O0

int nn_bind(int s,char *addr)

{
  int iVar1;
  int *piVar2;
  nn_sock *local_28;
  nn_sock *sock;
  char *pcStack_18;
  int rc;
  char *addr_local;
  int s_local;
  
  pcStack_18 = addr;
  addr_local._0_4_ = s;
  sock._4_4_ = nn_global_hold_socket(&local_28,s);
  if (-1 < sock._4_4_) {
    sock._4_4_ = nn_global_create_ep(local_28,pcStack_18,1);
    if (-1 < sock._4_4_) {
      nn_global_rele_socket(local_28);
      return sock._4_4_;
    }
    nn_global_rele_socket(local_28);
  }
  iVar1 = -sock._4_4_;
  piVar2 = __errno_location();
  *piVar2 = iVar1;
  return -1;
}

Assistant:

int nn_bind (int s, const char *addr)
{
    int rc;
    struct nn_sock *sock;

    rc = nn_global_hold_socket (&sock, s);
    if (rc < 0) {
        goto failure;
    }

    rc = nn_global_create_ep (sock, addr, 1);
    if (nn_slow (rc < 0)) {
        nn_global_rele_socket (sock);
        goto failure;
    }

    nn_global_rele_socket (sock);
    return rc;

failure:
    errno = -rc;
    return -1;
}